

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

string * __thiscall pbrt::Integrator::ToString_abi_cxx11_(Integrator *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  LightHandle *l_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range1_1;
  LightHandle *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range1;
  string s;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  PrimitiveHandle *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  string local_110 [32];
  reference local_f0;
  LightHandle *local_e8;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_e0;
  long local_d8;
  size_type local_d0;
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  reference local_58;
  LightHandle *local_50;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_48;
  long local_40;
  size_type local_38;
  string local_30 [48];
  
  __lhs = in_RDI;
  local_38 = std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::size
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                        (in_RSI + 8));
  StringPrintf<pbrt::PrimitiveHandle_const&,pbrt::Bounds3<float>const&,unsigned_long>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (Bounds3<float> *)in_stack_fffffffffffffed8,(unsigned_long *)in_stack_fffffffffffffed0)
  ;
  local_40 = in_RSI + 8;
  local_48._M_current =
       (LightHandle *)
       std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                 ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDI);
  local_50 = (LightHandle *)
             std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        *)__lhs,(__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
               ::operator*(&local_48);
    LightHandle::ToString_abi_cxx11_((LightHandle *)in_stack_fffffffffffffed8);
    StringPrintf<std::__cxx11::string>((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::operator+=(local_30,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    __gnu_cxx::
    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
    ::operator++(&local_48);
  }
  local_d0 = std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::size
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                        (in_RSI + 0x28));
  StringPrintf<unsigned_long>
            ((char *)in_stack_fffffffffffffed8,(unsigned_long *)in_stack_fffffffffffffed0);
  std::__cxx11::string::operator+=(local_30,local_c8);
  std::__cxx11::string::~string(local_c8);
  local_d8 = in_RSI + 0x28;
  local_e0._M_current =
       (LightHandle *)
       std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                 ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDI);
  local_e8 = (LightHandle *)
             std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        *)__lhs,(__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
               ::operator*(&local_e0);
    LightHandle::ToString_abi_cxx11_((LightHandle *)in_stack_fffffffffffffed8);
    StringPrintf<std::__cxx11::string>((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::operator+=(local_30,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    __gnu_cxx::
    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
    ::operator++(&local_e0);
  }
  std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string Integrator::ToString() const {
    std::string s = StringPrintf("[ Scene aggregate: %s sceneBounds: %s lights[%d]: [ ",
                                 aggregate, sceneBounds, lights.size());
    for (const auto &l : lights)
        s += StringPrintf("%s, ", l.ToString());
    s += StringPrintf("] infiniteLights[%d]: [ ", infiniteLights.size());
    for (const auto &l : infiniteLights)
        s += StringPrintf("%s, ", l.ToString());
    return s + " ]";
}